

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O1

int32_t adt_ary_indexOf(adt_ary_t *self,void *pElem)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  if (self != (adt_ary_t *)0x0) {
    uVar3 = (ulong)self->s32CurLen;
    bVar5 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      if (*self->pFirst == pElem) {
        uVar2 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if (uVar3 - 1 == uVar4) {
            return -1;
          }
          uVar2 = uVar4 + 1;
          lVar1 = uVar4 + 1;
          uVar4 = uVar2;
        } while (self->pFirst[lVar1] != pElem);
        bVar5 = uVar2 < uVar3;
      }
      if (bVar5) {
        return (int32_t)uVar2;
      }
    }
  }
  return -1;
}

Assistant:

int32_t adt_ary_indexOf(adt_ary_t *self, void *pElem)
{
   if (self != 0)
   {
      int32_t s32Index;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem) {
            return s32Index;
         }
      }
   }
   return -1;
}